

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CoverpointSymbol *symbol)

{
  bool bVar1;
  CoverageOptionSetter *option;
  CoverageOptionSetter *this_00;
  long lVar2;
  
  bVar1 = handleDefault<slang::ast::CoverpointSymbol>(this,symbol);
  if (bVar1) {
    CoverpointSymbol::getIffExpr(symbol);
    CoverpointSymbol::checkBins(symbol);
    this_00 = (symbol->options)._M_ptr;
    for (lVar2 = (symbol->options)._M_extent._M_extent_value * 0x18; lVar2 != 0;
        lVar2 = lVar2 + -0x18) {
      CoverageOptionSetter::getExpression(this_00);
      this_00 = this_00 + 1;
    }
  }
  return;
}

Assistant:

void handle(const CoverpointSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        symbol.getIffExpr();
        symbol.checkBins();
        for (auto& option : symbol.options)
            option.getExpression();
    }